

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O1

void __thiscall Fl_Widget::deactivate(Fl_Widget *this)

{
  Fl_Group *pFVar1;
  
  pFVar1 = (Fl_Group *)this;
  if ((this->flags_ & 1) == 0) {
    do {
      pFVar1 = *(Fl_Group **)((long)&pFVar1->super_Fl_Widget + 8);
      if (pFVar1 == (Fl_Group *)0x0) goto LAB_001dd22d;
    } while (((pFVar1->super_Fl_Widget).flags_ & 1) == 0);
    if (pFVar1 == (Fl_Group *)0x0) {
LAB_001dd22d:
      *(byte *)&this->flags_ = (byte)this->flags_ | 1;
      redraw(this);
      redraw_label(this);
      (*this->_vptr_Fl_Widget[3])(this,0xd);
      fl_throw_focus(this);
      return;
    }
  }
  *(byte *)&this->flags_ = (byte)this->flags_ | 1;
  return;
}

Assistant:

void Fl_Widget::deactivate() {
  if (active_r()) {
    set_flag(INACTIVE);
    redraw();
    redraw_label();
    handle(FL_DEACTIVATE);
    fl_throw_focus(this);
  } else {
    set_flag(INACTIVE);
  }
}